

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

void __thiscall QPDFJob::CopyAttConfig::CopyAttConfig(CopyAttConfig *this,Config *c)

{
  this->config = c;
  (this->caf).path._M_dataplus._M_p = (pointer)&(this->caf).path.field_2;
  (this->caf).path._M_string_length = 0;
  (this->caf).path.field_2._M_local_buf[0] = '\0';
  (this->caf).password._M_dataplus._M_p = (pointer)&(this->caf).password.field_2;
  (this->caf).password._M_string_length = 0;
  (this->caf).password.field_2._M_local_buf[0] = '\0';
  (this->caf).prefix._M_dataplus._M_p = (pointer)&(this->caf).prefix.field_2;
  (this->caf).prefix._M_string_length = 0;
  (this->caf).prefix.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

QPDFJob::CopyAttConfig::CopyAttConfig(Config* c) :
    config(c)
{
}